

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.cpp
# Opt level: O0

void __thiscall
duckdb::ColumnReader::ApplyPendingSkips
          (ColumnReader *this,data_ptr_t define_out,data_ptr_t repeat_out)

{
  type pRVar1;
  shared_ptr<duckdb::ResizeableBuffer,_true> *this_00;
  ColumnReader *in_RSI;
  optional_ptr<duckdb::TableFilterState,_true> in_RDI;
  DeltaByteArrayDecoder *unaff_retaddr;
  uint8_t *define_ptr;
  bool all_valid;
  idx_t skip_now;
  idx_t to_skip;
  idx_t num_values;
  ColumnReader *in_stack_ffffffffffffff98;
  ColumnReader *this_01;
  optional_ptr<const_duckdb::TableFilter,_true> in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  optional_ptr<duckdb::TableFilterState,_true> in_stack_ffffffffffffffc0;
  optional_ptr<const_duckdb::TableFilter,_true> local_38;
  idx_t local_30;
  ColumnReader *local_28;
  ColumnReader *local_20;
  TableFilterState *defines;
  
  if (in_RDI.ptr[3]._vptr_TableFilterState != (_func_int **)0x0) {
    local_28 = (ColumnReader *)in_RDI.ptr[3]._vptr_TableFilterState;
    in_RDI.ptr[3]._vptr_TableFilterState = (_func_int **)0x0;
    local_20 = local_28;
    defines = in_RDI.ptr;
    BeginRead((ColumnReader *)in_stack_ffffffffffffffc0.ptr,
              (data_ptr_t)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),
              (data_ptr_t)in_stack_ffffffffffffffb0.ptr);
    for (; local_28 != (ColumnReader *)0x0; local_28 = (ColumnReader *)((long)local_28 - local_30))
    {
      this_01 = local_28;
      optional_ptr<const_duckdb::TableFilter,_true>::optional_ptr(&local_38,(TableFilter *)0x0);
      optional_ptr<duckdb::TableFilterState,_true>::optional_ptr
                ((optional_ptr<duckdb::TableFilterState,_true> *)&stack0xffffffffffffffc0,
                 (TableFilterState *)0x0);
      local_30 = ReadPageHeaders(this_01,(idx_t)in_stack_ffffffffffffff98,in_stack_ffffffffffffffb0,
                                 in_RDI);
      in_stack_ffffffffffffffbf =
           PrepareRead((ColumnReader *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8)
                       ,(idx_t)in_stack_ffffffffffffffb0.ptr,(data_ptr_t)in_RDI.ptr,
                       (data_ptr_t)this_01,(idx_t)in_stack_ffffffffffffff98);
      in_stack_ffffffffffffff98 = in_RSI;
      if ((bool)in_stack_ffffffffffffffbf) {
        in_stack_ffffffffffffff98 = (ColumnReader *)0x0;
      }
      this_00 = (shared_ptr<duckdb::ResizeableBuffer,_true> *)
                (ulong)(*(int *)&in_RDI.ptr[0xc]._vptr_TableFilterState - 1);
      in_stack_ffffffffffffffb0.ptr = (TableFilter *)in_stack_ffffffffffffff98;
      switch(this_00) {
      case (shared_ptr<duckdb::ResizeableBuffer,_true> *)0x0:
        DictionaryDecoder::Skip
                  ((DictionaryDecoder *)in_stack_ffffffffffffffc0.ptr,
                   (uint8_t *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),
                   (idx_t)in_stack_ffffffffffffff98);
        break;
      case (shared_ptr<duckdb::ResizeableBuffer,_true> *)0x1:
        DeltaBinaryPackedDecoder::Skip
                  ((DeltaBinaryPackedDecoder *)in_stack_ffffffffffffffc0.ptr,
                   (uint8_t *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),
                   (idx_t)in_stack_ffffffffffffff98);
        break;
      case (shared_ptr<duckdb::ResizeableBuffer,_true> *)0x2:
        RLEDecoder::Skip((RLEDecoder *)this_01,(uint8_t *)in_stack_ffffffffffffff98,(idx_t)this_00);
        break;
      case (shared_ptr<duckdb::ResizeableBuffer,_true> *)0x3:
        DeltaLengthByteArrayDecoder::Skip
                  ((DeltaLengthByteArrayDecoder *)this_01,(uint8_t *)in_stack_ffffffffffffff98,
                   (idx_t)this_00);
        break;
      case (shared_ptr<duckdb::ResizeableBuffer,_true> *)0x4:
        DeltaByteArrayDecoder::Skip(unaff_retaddr,(uint8_t *)defines,(idx_t)in_RSI);
        break;
      case (shared_ptr<duckdb::ResizeableBuffer,_true> *)0x5:
        ByteStreamSplitDecoder::Skip
                  ((ByteStreamSplitDecoder *)in_stack_ffffffffffffffc0.ptr,
                   (uint8_t *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),
                   (idx_t)in_stack_ffffffffffffff98);
        break;
      default:
        pRVar1 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator*(this_00);
        (*(in_RDI.ptr)->_vptr_TableFilterState[0xd])
                  (in_RDI.ptr,pRVar1,in_stack_ffffffffffffffb0.ptr,local_30);
      }
      in_RDI.ptr[7]._vptr_TableFilterState =
           (_func_int **)((long)in_RDI.ptr[7]._vptr_TableFilterState - local_30);
    }
    FinishRead((ColumnReader *)in_stack_ffffffffffffffb0.ptr,(idx_t)in_RDI.ptr);
  }
  return;
}

Assistant:

void ColumnReader::ApplyPendingSkips(data_ptr_t define_out, data_ptr_t repeat_out) {
	if (pending_skips == 0) {
		return;
	}
	idx_t num_values = pending_skips;
	pending_skips = 0;

	auto to_skip = num_values;
	// start reading but do not apply skips (we are skipping now)
	BeginRead(nullptr, nullptr);

	while (to_skip > 0) {
		auto skip_now = ReadPageHeaders(to_skip);
		const auto all_valid = PrepareRead(skip_now, define_out, repeat_out, 0);

		const auto define_ptr = all_valid ? nullptr : static_cast<uint8_t *>(define_out);
		switch (encoding) {
		case ColumnEncoding::DICTIONARY:
			dictionary_decoder.Skip(define_ptr, skip_now);
			break;
		case ColumnEncoding::DELTA_BINARY_PACKED:
			delta_binary_packed_decoder.Skip(define_ptr, skip_now);
			break;
		case ColumnEncoding::RLE:
			rle_decoder.Skip(define_ptr, skip_now);
			break;
		case ColumnEncoding::DELTA_LENGTH_BYTE_ARRAY:
			delta_length_byte_array_decoder.Skip(define_ptr, skip_now);
			break;
		case ColumnEncoding::DELTA_BYTE_ARRAY:
			delta_byte_array_decoder.Skip(define_ptr, skip_now);
			break;
		case ColumnEncoding::BYTE_STREAM_SPLIT:
			byte_stream_split_decoder.Skip(define_ptr, skip_now);
			break;
		default:
			PlainSkip(*block, define_ptr, skip_now);
			break;
		}
		page_rows_available -= skip_now;
		to_skip -= skip_now;
	}
	FinishRead(num_values);
}